

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O2

StatusOr<google::protobuf::FeatureSetDefaults> * __thiscall
google::protobuf::FeatureResolver::CompileDefaults
          (StatusOr<google::protobuf::FeatureSetDefaults> *__return_storage_ptr__,
          FeatureResolver *this,Descriptor *feature_set,
          Span<const_google::protobuf::FieldDescriptor_*const> extensions,Edition minimum_edition,
          Edition maximum_edition)

{
  ushort uVar1;
  FieldDescriptor *pFVar2;
  bool bVar3;
  Descriptor *pDVar4;
  reference pEVar5;
  Message *pMVar6;
  MessageLite *this_00;
  MessageLite *this_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>_>
  *this_02;
  FeatureSet *pFVar7;
  AlphaNum *pAVar8;
  char *pcVar9;
  char *pcVar10;
  iterator *this_03;
  Edition EVar11;
  AlphaNum *pAVar12;
  iterator iVar13;
  Metadata MVar14;
  basic_string_view<char,_std::char_traits<char>_> args_1;
  basic_string_view<char,_std::char_traits<char>_> args_1_00;
  string_view data;
  string_view data_00;
  basic_string_view<char,_std::char_traits<char>_> args_3;
  string_view message;
  Status _status_1;
  Status _status_3;
  FeatureSetDefaults defaults;
  btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
  editions;
  iterator local_100;
  AlphaNum local_f0;
  AlphaNum *local_c0;
  long *local_b8;
  undefined1 local_b0 [56];
  Descriptor *local_78;
  Edition local_6c;
  string local_68;
  undefined1 local_48 [16];
  Descriptor *local_38;
  
  pAVar8 = (AlphaNum *)extensions.ptr_;
  EVar11 = (Edition)extensions.len_;
  local_c0 = pAVar8;
  local_78 = feature_set;
  if ((int)minimum_edition < (int)EVar11) {
    (anonymous_namespace)::
    Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
              ((_anonymous_namespace_ *)local_b0,"Invalid edition range, edition ",EVar11,
               " is newer than edition ",minimum_edition);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>,
               (Status *)local_b0);
LAB_001b573a:
    this_03 = (iterator *)local_b0;
LAB_001b573f:
    absl::lts_20250127::Status::~Status((Status *)this_03);
    return __return_storage_ptr__;
  }
  if (this == (FeatureResolver *)0x0) {
    (anonymous_namespace)::Error<char_const*>
              ((_anonymous_namespace_ *)local_b0,
               "Unable to find definition of google.protobuf.FeatureSet in descriptor pool.");
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>,
               (Status *)local_b0);
    goto LAB_001b573a;
  }
  anon_unknown_21::ValidateDescriptor((anon_unknown_21 *)local_b0,(Descriptor *)this);
  if ((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
       *)local_b0._0_8_ !=
      (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
       *)0x1) {
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    StatusOrData<const_absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>,
               (Status *)local_b0);
    goto LAB_001b573a;
  }
  local_6c = EVar11;
  absl::lts_20250127::Status::~Status((Status *)local_b0);
  local_c0 = (AlphaNum *)((long)local_c0 << 3);
  local_38 = (Descriptor *)this;
  for (pAVar12 = (AlphaNum *)0x0; local_c0 != pAVar12;
      pAVar12 = (AlphaNum *)&(pAVar12->piece_)._M_str) {
    pFVar2 = *(FieldDescriptor **)(pAVar12->digits_ + (long)&local_78[-1].extension_range_count_);
    if (pFVar2 == (FieldDescriptor *)0x0) {
      pcVar10 = (((Descriptor *)this)->all_names_).payload_;
      pcVar9 = (char *)(ulong)*(ushort *)(pcVar10 + 2);
      pAVar8 = (AlphaNum *)(pcVar10 + ~(ulong)pcVar9);
      pcVar10 = "Unknown extension of ";
LAB_001b5494:
      args_1_00._M_str = pcVar9;
      args_1_00._M_len = (size_t)pcVar10;
      (anonymous_namespace)::
      Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                ((char *)&local_100,args_1_00,(char *)pAVar8);
LAB_001b5499:
      if (local_100.node_ !=
          (btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
           *)0x1) {
        absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
        StatusOrData<const_absl::lts_20250127::Status,_0>
                  (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>
                   ,(Status *)&local_100);
        this_03 = &local_100;
        goto LAB_001b573f;
      }
    }
    else {
      if (pFVar2->containing_type_ != (Descriptor *)this) {
        pcVar10 = (pFVar2->all_names_).payload_;
        uVar1 = *(ushort *)(pcVar10 + 2);
        pAVar8 = (AlphaNum *)(pcVar10 + ~(ulong)uVar1);
        local_48._8_8_ = (((Descriptor *)this)->all_names_).payload_;
        local_48._0_8_ = ZEXT28(*(ushort *)(local_48._8_8_ + 2));
        local_48._8_8_ = local_48._8_8_ + ~local_48._0_8_;
        args_1._M_str._0_2_ = uVar1;
        args_1._M_len = (size_t)"Extension ";
        args_1._M_str._2_6_ = 0;
        args_3._M_str = ".";
        args_3._M_len = (size_t)" is not an extension of ";
        (anonymous_namespace)::
        Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                  ((char *)&local_100,args_1,(char *)pAVar8,args_3,(char *)local_48._0_8_);
        goto LAB_001b5499;
      }
      pDVar4 = FieldDescriptor::message_type(pFVar2);
      if (pDVar4 == (Descriptor *)0x0) {
        pcVar10 = (pFVar2->all_names_).payload_;
        pcVar9 = (char *)(ulong)*(ushort *)(pcVar10 + 2);
        pAVar8 = (AlphaNum *)(pcVar10 + ~(ulong)pcVar9);
        pcVar10 = "FeatureSet extension ";
        goto LAB_001b5494;
      }
      bVar3 = FieldDescriptor::is_repeated(pFVar2);
      if (bVar3) {
        pcVar10 = (pFVar2->all_names_).payload_;
        pcVar9 = (char *)(ulong)*(ushort *)(pcVar10 + 2);
        local_b0._0_16_ =
             (undefined1  [16])
             absl::lts_20250127::NullSafeStringView
                       (
                       "Only singular features extensions are supported.  Found repeated extension "
                       );
        local_f0.piece_._M_len = (size_t)pcVar9;
        local_f0.piece_._M_str = pcVar10 + ~(ulong)pcVar9;
        absl::lts_20250127::StrCat_abi_cxx11_(&local_68,(lts_20250127 *)local_b0,&local_f0,pAVar8);
        message._M_str = (char *)local_68._M_string_length;
        message._M_len = (size_t)&local_100;
        absl::lts_20250127::FailedPreconditionError(message);
        std::__cxx11::string::~string((string *)&local_68);
        this = (FeatureResolver *)local_38;
        goto LAB_001b5499;
      }
      pDVar4 = FieldDescriptor::message_type(pFVar2);
      if ((0 < pDVar4->extension_count_) ||
         (pDVar4 = FieldDescriptor::message_type(pFVar2), 0 < pDVar4->extension_range_count_)) {
        pcVar10 = (pFVar2->all_names_).payload_;
        pcVar9 = (char *)(ulong)*(ushort *)(pcVar10 + 2);
        pAVar8 = (AlphaNum *)(pcVar10 + ~(ulong)pcVar9);
        pcVar10 = "Nested extensions in feature extension ";
        goto LAB_001b5494;
      }
      local_100.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
            *)0x1;
    }
    absl::lts_20250127::Status::~Status((Status *)&local_100);
    pDVar4 = FieldDescriptor::message_type(pFVar2);
    anon_unknown_21::ValidateDescriptor((anon_unknown_21 *)local_b0,pDVar4);
    if ((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
         *)local_b0._0_8_ !=
        (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
         *)0x1) {
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
      StatusOrData<const_absl::lts_20250127::Status,_0>
                (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>,
                 (Status *)local_b0);
      goto LAB_001b573a;
    }
    absl::lts_20250127::Status::~Status((Status *)local_b0);
  }
  local_68._M_dataplus._M_p =
       absl::lts_20250127::container_internal::
       btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
       ::EmptyNode()::empty_node;
  local_68._M_string_length =
       (size_type)
       absl::lts_20250127::container_internal::
       btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
       ::EmptyNode()::empty_node;
  local_68.field_2._M_allocated_capacity = 0;
  anon_unknown_21::CollectEditions
            ((Descriptor *)this,minimum_edition,
             (btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
              *)&local_68);
  EVar11 = local_6c;
  for (pAVar8 = (AlphaNum *)0x0; local_c0 != pAVar8; pAVar8 = (AlphaNum *)&(pAVar8->piece_)._M_str)
  {
    pDVar4 = FieldDescriptor::message_type
                       (*(FieldDescriptor **)
                         (pAVar8->digits_ + (long)&local_78[-1].extension_range_count_));
    anon_unknown_21::CollectEditions
              (pDVar4,minimum_edition,
               (btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
                *)&local_68);
  }
  if (local_68.field_2._M_allocated_capacity == 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
               ,0x1c4,"!editions.empty()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_b0)
    ;
  }
  iVar13 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
           ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                    *)&local_68);
  local_b0._0_12_ = iVar13._0_12_;
  pEVar5 = absl::lts_20250127::container_internal::
           btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
           ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                        *)local_b0);
  if (*pEVar5 == EDITION_LEGACY) {
    iVar13 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
             ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                      *)&local_68);
    local_b0._0_12_ = iVar13._0_12_;
    pEVar5 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
             ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                          *)local_b0);
    if ((int)*pEVar5 <= (int)EVar11) {
      FeatureSetDefaults::FeatureSetDefaults((FeatureSetDefaults *)local_b0);
      FeatureSetDefaults::set_minimum_edition((FeatureSetDefaults *)local_b0,EVar11);
      FeatureSetDefaults::set_maximum_edition((FeatureSetDefaults *)local_b0,minimum_edition);
      std::make_unique<google::protobuf::DynamicMessageFactory>();
      iVar13 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
               ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                        *)&local_68);
      local_48._0_8_ = iVar13.node_;
      local_48._8_4_ = iVar13.position_;
      iVar13 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
               ::end((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                      *)&local_68);
      local_100.node_ = iVar13.node_;
      local_100.position_ = iVar13.position_;
      while( true ) {
        bVar3 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                              *)local_48,&local_100);
        if (!bVar3) break;
        pEVar5 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                 ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                              *)local_48);
        pMVar6 = (Message *)(**(code **)(*local_b8 + 0x10))(local_b8,this);
        this_00 = &Message::New(pMVar6)->super_MessageLite;
        pMVar6 = (Message *)(**(code **)(*local_b8 + 0x10))(local_b8,this);
        this_01 = &Message::New(pMVar6)->super_MessageLite;
        anon_unknown_21::FillDefaults
                  ((Edition)&local_f0,(Message *)(ulong)*pEVar5,(Message *)this_00);
        if ((char *)local_f0.piece_._M_len != (char *)0x1) {
          absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>
          ::StatusOrData<const_absl::lts_20250127::Status,_0>
                    (&__return_storage_ptr__->
                      super_StatusOrData<google::protobuf::FeatureSetDefaults>,(Status *)&local_f0);
          absl::lts_20250127::Status::~Status((Status *)&local_f0);
LAB_001b59f1:
          (*this_01->_vptr_MessageLite[1])(this_01);
          (*this_00->_vptr_MessageLite[1])(this_00);
          goto LAB_001b5a04;
        }
        absl::lts_20250127::Status::~Status((Status *)&local_f0);
        for (pAVar8 = (AlphaNum *)0x0; local_c0 != pAVar8;
            pAVar8 = (AlphaNum *)&(pAVar8->piece_)._M_str) {
          pFVar2 = *(FieldDescriptor **)
                    (pAVar8->digits_ + (long)&local_78[-1].extension_range_count_);
          EVar11 = *pEVar5;
          MVar14 = Message::GetMetadata((Message *)this_00);
          pMVar6 = Reflection::MutableMessage
                             (MVar14.reflection,(Message *)this_00,pFVar2,(MessageFactory *)0x0);
          MVar14 = Message::GetMetadata((Message *)this_01);
          Reflection::MutableMessage
                    (MVar14.reflection,(Message *)this_01,pFVar2,(MessageFactory *)0x0);
          anon_unknown_21::FillDefaults((Edition)&local_f0,(Message *)(ulong)EVar11,pMVar6);
          if ((char *)local_f0.piece_._M_len != (char *)0x1) {
            absl::lts_20250127::internal_statusor::
            StatusOrData<google::protobuf::FeatureSetDefaults>::
            StatusOrData<const_absl::lts_20250127::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::FeatureSetDefaults>,(Status *)&local_f0
                      );
            absl::lts_20250127::Status::~Status((Status *)&local_f0);
            goto LAB_001b59f1;
          }
          absl::lts_20250127::Status::~Status((Status *)&local_f0);
        }
        this_02 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
                            ((RepeatedPtrFieldBase *)(local_b0 + 0x18));
        this = (FeatureResolver *)local_38;
        FeatureSetDefaults_FeatureSetEditionDefault::set_edition(this_02,*pEVar5);
        pFVar7 = FeatureSetDefaults_FeatureSetEditionDefault::mutable_fixed_features(this_02);
        MessageLite::SerializeAsString_abi_cxx11_((string *)&local_f0,this_00);
        data._M_str = (char *)local_f0.piece_._M_len;
        data._M_len = (size_t)local_f0.piece_._M_str;
        MessageLite::MergeFromString((MessageLite *)pFVar7,data);
        std::__cxx11::string::~string((string *)&local_f0);
        pFVar7 = FeatureSetDefaults_FeatureSetEditionDefault::mutable_overridable_features(this_02);
        MessageLite::SerializeAsString_abi_cxx11_((string *)&local_f0,this_01);
        data_00._M_str = (char *)local_f0.piece_._M_len;
        data_00._M_len = (size_t)local_f0.piece_._M_str;
        MessageLite::MergeFromString((MessageLite *)pFVar7,data_00);
        std::__cxx11::string::~string((string *)&local_f0);
        (*this_01->_vptr_MessageLite[1])(this_01);
        (*this_00->_vptr_MessageLite[1])();
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
        ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                     *)local_48);
      }
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
      StatusOrData<google::protobuf::FeatureSetDefaults>
                (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>,
                 local_b0);
LAB_001b5a04:
      if (local_b8 != (long *)0x0) {
        (**(code **)(*local_b8 + 8))();
      }
      FeatureSetDefaults::~FeatureSetDefaults((FeatureSetDefaults *)local_b0);
      goto LAB_001b5a1e;
    }
    iVar13 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
             ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                      *)&local_68);
    local_b0._0_12_ = iVar13._0_12_;
    pEVar5 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
             ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                          *)local_b0);
    (anonymous_namespace)::
    Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
              ((_anonymous_namespace_ *)&local_f0,"Minimum edition ",EVar11,
               " is earlier than the oldest valid edition ",*pEVar5);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>,
               (Status *)&local_f0);
  }
  else {
    iVar13 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
             ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                      *)&local_68);
    local_b0._0_12_ = iVar13._0_12_;
    pEVar5 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
             ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                          *)local_b0);
    (anonymous_namespace)::Error<char_const*,google::protobuf::Edition,char_const*>
              ((_anonymous_namespace_ *)&local_f0,"Minimum edition ",*pEVar5,
               " is not EDITION_LEGACY");
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSetDefaults>,
               (Status *)&local_f0);
  }
  absl::lts_20250127::Status::~Status((Status *)&local_f0);
LAB_001b5a1e:
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
  ::~btree((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
            *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSetDefaults> FeatureResolver::CompileDefaults(
    const Descriptor* feature_set,
    absl::Span<const FieldDescriptor* const> extensions,
    Edition minimum_edition, Edition maximum_edition) {
  if (minimum_edition > maximum_edition) {
    return Error("Invalid edition range, edition ", minimum_edition,
                 " is newer than edition ", maximum_edition);
  }
  // Find and validate the FeatureSet in the pool.
  if (feature_set == nullptr) {
    return Error(
        "Unable to find definition of google.protobuf.FeatureSet in descriptor pool.");
  }
  RETURN_IF_ERROR(ValidateDescriptor(*feature_set));

  // Collect and validate all the FeatureSet extensions.
  for (const auto* extension : extensions) {
    RETURN_IF_ERROR(ValidateExtension(*feature_set, extension));
    RETURN_IF_ERROR(ValidateDescriptor(*extension->message_type()));
  }

  // Collect all the editions with unique defaults.
  absl::btree_set<Edition> editions;
  CollectEditions(*feature_set, maximum_edition, editions);
  for (const auto* extension : extensions) {
    CollectEditions(*extension->message_type(), maximum_edition, editions);
  }
  // Sanity check validation conditions above.
  ABSL_CHECK(!editions.empty());
  if (*editions.begin() != EDITION_LEGACY) {
    return Error("Minimum edition ", *editions.begin(),
                 " is not EDITION_LEGACY");
  }

  if (*editions.begin() > minimum_edition) {
    return Error("Minimum edition ", minimum_edition,
                 " is earlier than the oldest valid edition ",
                 *editions.begin());
  }

  // Fill the default spec.
  FeatureSetDefaults defaults;
  defaults.set_minimum_edition(minimum_edition);
  defaults.set_maximum_edition(maximum_edition);
  auto message_factory = absl::make_unique<DynamicMessageFactory>();
  for (const auto& edition : editions) {
    auto fixed_defaults_dynamic =
        absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
    auto overridable_defaults_dynamic =
        absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
    RETURN_IF_ERROR(FillDefaults(edition, *fixed_defaults_dynamic,
                                 *overridable_defaults_dynamic));
    for (const auto* extension : extensions) {
      RETURN_IF_ERROR(FillDefaults(
          edition,
          *fixed_defaults_dynamic->GetReflection()->MutableMessage(
              fixed_defaults_dynamic.get(), extension),
          *overridable_defaults_dynamic->GetReflection()->MutableMessage(
              overridable_defaults_dynamic.get(), extension)));
    }
    auto* edition_defaults = defaults.mutable_defaults()->Add();
    edition_defaults->set_edition(edition);
    edition_defaults->mutable_fixed_features()->MergeFromString(
        fixed_defaults_dynamic->SerializeAsString());
    edition_defaults->mutable_overridable_features()->MergeFromString(
        overridable_defaults_dynamic->SerializeAsString());
  }
  return defaults;
}